

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# px_config.c
# Opt level: O0

int katherine_px_config_load_bmc_file(katherine_px_config_t *px_config,char *file_path)

{
  FILE *__stream;
  int *piVar1;
  katherine_bmc_t *bmc;
  size_t sVar2;
  size_t actual_size;
  katherine_bmc_t *buffer;
  FILE *file;
  size_t expected_size;
  int res;
  char *file_path_local;
  katherine_px_config_t *px_config_local;
  
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    piVar1 = __errno_location();
    expected_size._4_4_ = *piVar1;
  }
  else {
    bmc = (katherine_bmc_t *)malloc(0x10000);
    if (bmc == (katherine_bmc_t *)0x0) {
      expected_size._4_4_ = 0xc;
    }
    else {
      sVar2 = fread(bmc,1,0x10000,__stream);
      if (sVar2 == 0x10000) {
        expected_size._4_4_ = katherine_px_config_load_bmc_data(px_config,bmc);
      }
      else {
        expected_size._4_4_ = 5;
      }
      free(bmc);
    }
    fclose(__stream);
  }
  return expected_size._4_4_;
}

Assistant:

int
katherine_px_config_load_bmc_file(katherine_px_config_t *px_config, const char *file_path)
{
    int res = 0;

    const size_t expected_size = sizeof(katherine_bmc_t);
    FILE* file = fopen(file_path, "rb");
    if (file == NULL) {
        res = errno;
        goto err_fopen;
    }

    katherine_bmc_t *buffer = (katherine_bmc_t *) malloc(expected_size);
    if (buffer == NULL) {
        res = ENOMEM;
        goto err_buffer;
    }

    const size_t actual_size = fread(buffer, 1, expected_size, file);
    if (expected_size != actual_size) {
        res = EIO;
        goto err_fread;
    }

    res = katherine_px_config_load_bmc_data(px_config, buffer);

err_fread:
    free(buffer);    
err_buffer:
    fclose(file);
err_fopen:
    return res;
}